

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::ClearScriptContextCaches(ScriptContext *this)

{
  TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>,_JsUtil::Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>,_Js::EvalMapStringInternal<false>_>
  *pTVar1;
  Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
  *this_00;
  bool bVar2;
  JavascriptLibrary *pJVar3;
  RegexPatternMruMap *this_01;
  
  if ((this->isPerformingNonreentrantWork == false) && (this->hasUsedInlineCache == true)) {
    this->isPerformingNonreentrantWork = true;
    if (this->isScriptContextActuallyClosed == false) {
      if (DAT_0145c350 == '\x01') {
        bVar2 = IsScriptContextInDebugMode(this);
        if (!bVar2) {
          pJVar3 = (this->super_ScriptContextBase).javascriptLibrary;
          pTVar1 = (pJVar3->cache).evalCacheDictionary.ptr;
          if (pTVar1 != (TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>,_JsUtil::Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>,_Js::EvalMapStringInternal<false>_>
                         *)0x0) {
            JsUtil::
            Cache<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,15,Memory::Recycler>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry>
            ::
            Clean<Js::ScriptContext::CleanDynamicFunctionCache<JsUtil::Cache<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,15,Memory::Recycler>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry>>(JsUtil::Cache<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,15,Memory::Recycler>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry>*)::_lambda(Js::EvalMapStringInternal<true>const&,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*)_1_>
                      ((Cache<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,15,Memory::Recycler>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry>
                        *)(pTVar1->dictionary).ptr,(anon_class_8_1_8991fb9c_for_callback)this);
            pJVar3 = (this->super_ScriptContextBase).javascriptLibrary;
          }
          pTVar1 = (pJVar3->cache).indirectEvalCacheDictionary.ptr;
          if (pTVar1 != (TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>,_JsUtil::Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>,_Js::EvalMapStringInternal<false>_>
                         *)0x0) {
            JsUtil::
            Cache<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,15,Memory::Recycler>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry>
            ::
            Clean<Js::ScriptContext::CleanDynamicFunctionCache<JsUtil::Cache<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,15,Memory::Recycler>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry>>(JsUtil::Cache<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,15,Memory::Recycler>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry>*)::_lambda(Js::EvalMapStringInternal<true>const&,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*)_1_>
                      ((Cache<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,15,Memory::Recycler>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry>
                        *)(pTVar1->dictionary).ptr,(anon_class_8_1_8991fb9c_for_callback)this);
            pJVar3 = (this->super_ScriptContextBase).javascriptLibrary;
          }
          this_00 = (pJVar3->cache).newFunctionCache.ptr;
          if (this_00 !=
              (Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
               *)0x0) {
            JsUtil::
            Cache<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,15,Memory::Recycler>,DefaultComparer,JsUtil::SimpleDictionaryEntry>
            ::
            Clean<Js::ScriptContext::CleanDynamicFunctionCache<JsUtil::Cache<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,15,Memory::Recycler>,DefaultComparer,JsUtil::SimpleDictionaryEntry>>(JsUtil::Cache<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,15,Memory::Recycler>,DefaultComparer,JsUtil::SimpleDictionaryEntry>*)::_lambda(Js::EvalMapStringInternal<false>const&,Js::FunctionInfo*)_1_>
                      ((Cache<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,15,Memory::Recycler>,DefaultComparer,JsUtil::SimpleDictionaryEntry>
                        *)this_00,(anon_class_8_1_8991fb9c_for_callback)this);
          }
          if (this->hostScriptContext != (HostScriptContext *)0x0) {
            (*this->hostScriptContext->_vptr_HostScriptContext[0xb])();
          }
        }
      }
      if (0 < DAT_014594a0) {
        this_01 = GetDynamicRegexMap(this);
        JsUtil::
        MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
        ::RemoveRecentlyUnusedItems(this_01);
      }
      CleanSourceListInternal(this,false);
    }
    this->isPerformingNonreentrantWork = false;
  }
  return;
}

Assistant:

void ScriptContext::ClearScriptContextCaches()
    {
        // Prevent reentrancy for the following work, which is not required to be done on every call to this function including
        // reentrant calls
        if (this->isPerformingNonreentrantWork || !this->hasUsedInlineCache)
        {
            return;
        }

        class AutoCleanup
        {
        private:
            ScriptContext *const scriptContext;

        public:
            AutoCleanup(ScriptContext *const scriptContext) : scriptContext(scriptContext)
            {
                scriptContext->isPerformingNonreentrantWork = true;
            }

            ~AutoCleanup()
            {
                scriptContext->isPerformingNonreentrantWork = false;
            }
        } autoCleanup(this);

        if (this->isScriptContextActuallyClosed)
        {
            return;
        }

        if (EnableEvalMapCleanup())
        {
            // The eval map is not re-entrant, so make sure it's not in the middle of adding an entry
            // Also, don't clean the eval map if the debugger is attached
            if (!this->IsScriptContextInDebugMode())
            {
                if (this->Cache()->evalCacheDictionary != nullptr)
                {
                    this->CleanDynamicFunctionCache<Js::EvalCacheTopLevelDictionary>(this->Cache()->evalCacheDictionary->GetDictionary());
                }
                if (this->Cache()->indirectEvalCacheDictionary != nullptr)
                {
                    this->CleanDynamicFunctionCache<Js::EvalCacheTopLevelDictionary>(this->Cache()->indirectEvalCacheDictionary->GetDictionary());
                }
                if (this->Cache()->newFunctionCache != nullptr)
                {
                    this->CleanDynamicFunctionCache<Js::NewFunctionCache>(this->Cache()->newFunctionCache);
                }
                if (this->hostScriptContext != nullptr)
                {
                    this->hostScriptContext->CleanDynamicCodeCache();
                }

            }
        }

        if (REGEX_CONFIG_FLAG(DynamicRegexMruListSize) > 0)
        {
            GetDynamicRegexMap()->RemoveRecentlyUnusedItems();
        }

        CleanSourceListInternal(true);
    }